

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesColor.cxx
# Opt level: O0

void cmCursesColor::InitColors(void)

{
  bool bVar1;
  short sVar2;
  
  bVar1 = HasColors();
  if (bVar1) {
    start_color();
    use_default_colors();
    sVar2 = GetColor('N',1);
    init_pair(1,(int)sVar2,0xffffffff);
    sVar2 = GetColor('Y',2);
    init_pair(2,(int)sVar2,0xffffffff);
    sVar2 = GetColor('S',6);
    init_pair(3,(int)sVar2,0xffffffff);
    sVar2 = GetColor('P',3);
    init_pair(4,(int)sVar2,0xffffffff);
    sVar2 = GetColor('C',5);
    init_pair(5,(int)sVar2,0xffffffff);
  }
  return;
}

Assistant:

void cmCursesColor::InitColors()
{
#ifdef HAVE_CURSES_USE_DEFAULT_COLORS
  if (HasColors()) {
    start_color();
    use_default_colors();
    init_pair(BoolOff, GetColor('N', COLOR_RED), -1);
    init_pair(BoolOn, GetColor('Y', COLOR_GREEN), -1);
    init_pair(String, GetColor('S', COLOR_CYAN), -1);
    init_pair(Path, GetColor('P', COLOR_YELLOW), -1);
    init_pair(Choice, GetColor('C', COLOR_MAGENTA), -1);
  }
#endif
}